

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImagePositionCalculator.cpp
# Opt level: O1

array<float,_16UL> * __thiscall
ImagePositionCalculator::GetCenteredRectangleVertexCoordinates
          (array<float,_16UL> *__return_storage_ptr__,ImagePositionCalculator *this,int deviceWidth,
          int deviceHeight,int imageWidth,int imageHeight)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar3 = (float)deviceWidth * 0.5 - (float)(imageWidth / 2);
  __return_storage_ptr__->_M_elems[0] = fVar3;
  fVar2 = (float)deviceHeight * 0.5 - (float)(imageHeight / 2);
  __return_storage_ptr__->_M_elems[1] = fVar2;
  __return_storage_ptr__->_M_elems[2] = 0.0;
  __return_storage_ptr__->_M_elems[3] = 0.0;
  fVar1 = (float)deviceWidth * 0.5 + (float)(imageWidth / 2);
  __return_storage_ptr__->_M_elems[4] = fVar1;
  __return_storage_ptr__->_M_elems[5] = fVar2;
  __return_storage_ptr__->_M_elems[6] = 1.0;
  __return_storage_ptr__->_M_elems[7] = 0.0;
  __return_storage_ptr__->_M_elems[8] = fVar1;
  fVar1 = (float)deviceHeight * 0.5 + (float)(imageHeight / 2);
  __return_storage_ptr__->_M_elems[9] = fVar1;
  __return_storage_ptr__->_M_elems[10] = 1.0;
  __return_storage_ptr__->_M_elems[0xb] = 1.0;
  __return_storage_ptr__->_M_elems[0xc] = fVar3;
  __return_storage_ptr__->_M_elems[0xd] = fVar1;
  __return_storage_ptr__->_M_elems[0xe] = 0.0;
  __return_storage_ptr__->_M_elems[0xf] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

std::array<float, 16> ImagePositionCalculator::GetCenteredRectangleVertexCoordinates(int deviceWidth, int deviceHeight, int imageWidth, int imageHeight)
{
    //assumes we are using an elements array to build the 2 triangles that make up the square
    //format is: x, y, s, t for each point [s, t are the normalized texture coordinates]
    return std::array<float, 16>{
        1.0f * deviceWidth / 2 - imageWidth / 2,
        1.0f * deviceHeight / 2 - imageHeight / 2, 0.0f, 0.0f,
        1.0f * deviceWidth / 2 + imageWidth / 2,
        1.0f * deviceHeight / 2 - imageHeight / 2, 1.0f, 0.0f,
        1.0f * deviceWidth / 2 + imageWidth / 2,
        1.0f * deviceHeight / 2 + imageHeight / 2, 1.0f, 1.0f,
        1.0f * deviceWidth / 2 - imageWidth / 2,
        1.0f * deviceHeight / 2 + imageHeight / 2, 0.0f, 1.0f};
}